

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O3

int duckdb_brotli::SafeDecodeLiteralBlockSwitch(BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br;
  byte bVar1;
  ushort uVar2;
  ulong uVar3;
  ulong uVar4;
  byte *pbVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  byte *pbVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint64_t uVar13;
  byte *pbVar14;
  HuffmanCode *pHVar15;
  HuffmanCode *pHVar16;
  ulong uVar17;
  bool bVar18;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  uVar17 = s->num_block_types[0];
  if (uVar17 < 2) {
LAB_01c0d710:
    iVar6 = 0;
  }
  else {
    pHVar15 = s->block_type_trees;
    pHVar16 = s->block_len_trees;
    br = &s->br;
    uVar3 = (s->br).val_;
    uVar4 = (s->br).bit_pos_;
    pbVar5 = (s->br).next_in;
    pbVar9 = (s->br).last_in;
    uVar7 = uVar3;
    uVar8 = uVar4;
    uVar11 = uVar4;
    pbVar14 = pbVar5;
    if (uVar4 < 0xf) {
      do {
        if (pbVar14 == pbVar9) {
          local_40 = uVar17;
          iVar6 = SafeDecodeSymbol(pHVar15,br,&local_48);
          uVar17 = local_40;
          if (iVar6 == 0) goto LAB_01c0d710;
          goto LAB_01c0d53f;
        }
        uVar7 = uVar7 | (ulong)*pbVar14 << ((byte)uVar8 & 0x3f);
        (s->br).val_ = uVar7;
        uVar11 = uVar8 + 8;
        (s->br).bit_pos_ = uVar11;
        (s->br).next_in = pbVar14 + 1;
        bVar18 = uVar8 < 7;
        uVar8 = uVar11;
        pbVar14 = pbVar14 + 1;
      } while (bVar18);
    }
    pHVar15 = pHVar15 + (uVar7 & 0xff);
    uVar10 = (ulong)pHVar15->bits;
    uVar8 = uVar7;
    if (8 < uVar10) {
      uVar11 = uVar11 - 8;
      uVar8 = uVar7 >> 8;
      pHVar15 = pHVar15 + (ulong)(*(uint *)(kBrotliBitMask + (ulong)(pHVar15->bits - 8) * 8) &
                                  (uint)(uVar7 >> 8) & 0x7f) + (ulong)pHVar15->value;
      uVar10 = (ulong)pHVar15->bits;
    }
    (s->br).bit_pos_ = uVar11 - uVar10;
    (s->br).val_ = uVar8 >> ((byte)uVar10 & 0x3f);
    local_48 = (ulong)pHVar15->value;
LAB_01c0d53f:
    if (s->substate_read_block_length == BROTLI_STATE_READ_BLOCK_LENGTH_NONE) {
      uVar11 = (s->br).bit_pos_;
      if (uVar11 < 0xf) {
        pbVar14 = (s->br).next_in;
        uVar8 = uVar11;
        do {
          if (pbVar14 == (s->br).last_in) {
            iVar6 = SafeDecodeSymbol(pHVar16,br,&local_38);
            if (iVar6 != 0) goto LAB_01c0d634;
            goto LAB_01c0d6d8;
          }
          uVar7 = (ulong)*pbVar14 << ((byte)uVar8 & 0x3f) | (s->br).val_;
          (s->br).val_ = uVar7;
          uVar11 = uVar8 + 8;
          (s->br).bit_pos_ = uVar11;
          pbVar14 = pbVar14 + 1;
          (s->br).next_in = pbVar14;
          bVar18 = uVar8 < 7;
          uVar8 = uVar11;
        } while (bVar18);
      }
      else {
        uVar7 = br->val_;
      }
      pHVar16 = pHVar16 + (uVar7 & 0xff);
      uVar10 = (ulong)pHVar16->bits;
      uVar8 = uVar7;
      if (8 < uVar10) {
        uVar11 = uVar11 - 8;
        uVar8 = uVar7 >> 8;
        pHVar16 = pHVar16 + (ulong)(*(uint *)(kBrotliBitMask + (ulong)(pHVar16->bits - 8) * 8) &
                                    (uint)(uVar7 >> 8) & 0x7f) + (ulong)pHVar16->value;
        uVar10 = (ulong)pHVar16->bits;
      }
      (s->br).bit_pos_ = uVar11 - uVar10;
      (s->br).val_ = uVar8 >> ((byte)uVar10 & 0x3f);
      local_38 = (ulong)pHVar16->value;
    }
    else {
      local_38 = s->block_length_index;
    }
LAB_01c0d634:
    bVar1 = _kBrotliPrefixCodeRanges[local_38 * 4 + 2];
    uVar7 = (ulong)bVar1;
    uVar2 = *(ushort *)(_kBrotliPrefixCodeRanges + local_38 * 4);
    uVar11 = (s->br).bit_pos_;
    if (uVar11 < uVar7) {
      pbVar14 = (s->br).next_in;
      do {
        if (pbVar14 == (s->br).last_in) {
          s->block_length_index = local_38;
LAB_01c0d6d8:
          lVar12 = (long)pbVar9 - (long)pbVar5;
          s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
          (s->br).val_ = uVar3;
          (s->br).bit_pos_ = uVar4;
          (s->br).next_in = pbVar5;
          (s->br).last_in = pbVar5 + lVar12;
          pbVar9 = pbVar5 + lVar12 + -0x1b;
          if (0xffffffffffffffe2 < lVar12 - 0x1cU) {
            pbVar9 = pbVar5;
          }
          (s->br).guard_in = pbVar9;
          goto LAB_01c0d710;
        }
        uVar13 = (ulong)*pbVar14 << ((byte)uVar11 & 0x3f) | (s->br).val_;
        (s->br).val_ = uVar13;
        uVar11 = uVar11 + 8;
        (s->br).bit_pos_ = uVar11;
        pbVar14 = pbVar14 + 1;
        (s->br).next_in = pbVar14;
      } while (uVar11 < uVar7);
    }
    else {
      uVar13 = br->val_;
    }
    uVar3 = *(ulong *)(kBrotliBitMask + uVar7 * 8);
    (s->br).bit_pos_ = uVar11 - uVar7;
    (s->br).val_ = uVar13 >> (bVar1 & 0x3f);
    s->block_length[0] = (uVar3 & uVar13) + (ulong)uVar2;
    s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
    if (local_48 == 0) {
      local_48 = s->block_type_rb[0];
    }
    else if (local_48 == 1) {
      local_48 = s->block_type_rb[1] + 1;
    }
    else {
      local_48 = local_48 - 2;
    }
    uVar11 = 0;
    if (uVar17 <= local_48) {
      uVar11 = uVar17;
    }
    local_48 = local_48 - uVar11;
    s->block_type_rb[0] = s->block_type_rb[1];
    s->block_type_rb[1] = local_48;
    s->context_map_slice = s->context_map + local_48 * 0x40;
    s->trivial_literal_context =
         (uint)((s->trivial_literal_contexts[local_48 >> 5] >> ((uint)local_48 & 0x1f) & 1) != 0);
    s->literal_htree = (s->literal_hgroup).htrees[s->context_map[local_48 * 0x40]];
    s->context_lookup = &_kBrotliContextLookupTable + ((s->context_modes[local_48] & 3) << 9);
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(int safe, BrotliDecoderState *s, int tree_type) {
	brotli_reg_t max_block_type = s->num_block_types[tree_type];
	const HuffmanCode *type_tree = &s->block_type_trees[tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
	const HuffmanCode *len_tree = &s->block_len_trees[tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
	BrotliBitReader *br = &s->br;
	brotli_reg_t *ringbuffer = &s->block_type_rb[tree_type * 2];
	brotli_reg_t block_type;
	if (max_block_type <= 1) {
		return BROTLI_FALSE;
	}

	/* Read 0..15 + 3..39 bits. */
	if (!safe) {
		block_type = ReadSymbol(type_tree, br);
		s->block_length[tree_type] = ReadBlockLength(len_tree, br);
	} else {
		BrotliBitReaderState memento;
		BrotliBitReaderSaveState(br, &memento);
		if (!SafeReadSymbol(type_tree, br, &block_type))
			return BROTLI_FALSE;
		if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
			s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
			BrotliBitReaderRestoreState(br, &memento);
			return BROTLI_FALSE;
		}
	}

	if (block_type == 1) {
		block_type = ringbuffer[1] + 1;
	} else if (block_type == 0) {
		block_type = ringbuffer[0];
	} else {
		block_type -= 2;
	}
	if (block_type >= max_block_type) {
		block_type -= max_block_type;
	}
	ringbuffer[0] = ringbuffer[1];
	ringbuffer[1] = block_type;
	return BROTLI_TRUE;
}